

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  int nKey;
  int iVar1;
  uint local_38;
  int j;
  int nName;
  int i;
  Table *p;
  char *zDatabase_local;
  char *zName_local;
  sqlite3 *db_local;
  
  _nName = (Table *)0x0;
  nKey = sqlite3Strlen30(zName);
  j = 0;
  while( true ) {
    if (db->nDb <= j) {
      return _nName;
    }
    if (j < 2) {
      local_38 = j ^ 1;
    }
    else {
      local_38 = j;
    }
    if (((zDatabase == (char *)0x0) ||
        (iVar1 = sqlite3_stricmp(zDatabase,db->aDb[(int)local_38].zName), iVar1 == 0)) &&
       (_nName = (Table *)sqlite3HashFind(&(db->aDb[(int)local_38].pSchema)->tblHash,zName,nKey),
       _nName != (Table *)0x0)) break;
    j = j + 1;
  }
  return _nName;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;
  int nName;
  assert( zName!=0 );
  nName = sqlite3Strlen30(zName);
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
    if( zDatabase!=0 && sqlite3StrICmp(zDatabase, db->aDb[j].zName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName, nName);
    if( p ) break;
  }
  return p;
}